

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O2

csp_iface_t * csp_iflist_get_by_name(char *name)

{
  csp_iface_t *pcVar1;
  int iVar2;
  csp_iface_t **ppcVar3;
  
  ppcVar3 = &interfaces;
  while( true ) {
    pcVar1 = *ppcVar3;
    if (pcVar1 == (csp_iface_t *)0x0) {
      return (csp_iface_t *)0x0;
    }
    iVar2 = strncmp(pcVar1->name,name,10);
    if (iVar2 == 0) break;
    ppcVar3 = &pcVar1->next;
  }
  return pcVar1;
}

Assistant:

csp_iface_t * csp_iflist_get_by_name(const char * name) {
	csp_iface_t * ifc = interfaces;
	while (ifc) {
		if (strncmp(ifc->name, name, CSP_IFLIST_NAME_MAX) == 0) {
			return ifc;
		}
		ifc = ifc->next;
	}
	return NULL;
}